

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatabuffer_p.h
# Opt level: O3

void __thiscall
QDataBuffer<QScanConverter::Line>::shrink(QDataBuffer<QScanConverter::Line> *this,qsizetype size)

{
  ulong uVar1;
  ulong uVar2;
  Line *pLVar3;
  size_t __size;
  
  if (size == 0) {
    QtPrivate::sizedFree(this->buffer,this->capacity << 5);
    this->capacity = 0;
    this->siz = 0;
    this->buffer = (Line *)0x0;
    return;
  }
  this->capacity = size;
  uVar2 = size;
  if ((ulong)size >> 0x3b == 0) {
    pLVar3 = this->buffer;
    __size = size << 5;
    uVar1 = QtPrivate::expectedAllocSize(__size,0x10);
    if (uVar1 != 0) {
      __size = uVar1 & 0xffffffffffffffe0;
      if (__size == 0) goto LAB_00428102;
      uVar2 = uVar1 >> 5;
    }
    pLVar3 = (Line *)realloc(pLVar3,__size);
    if (pLVar3 == (Line *)0x0) {
      uVar2 = size;
    }
  }
  else {
LAB_00428102:
    pLVar3 = (Line *)0x0;
  }
  this->capacity = uVar2;
  this->buffer = pLVar3;
  if (this->siz < size) {
    size = this->siz;
  }
  this->siz = size;
  return;
}

Assistant:

void shrink(qsizetype size) {
        Q_ASSERT(capacity >= size);
        if (size) {
            capacity = size;
            buffer = (Type*) QtPrivate::fittedRealloc(static_cast<void*>(buffer), 0, &capacity, sizeof(Type));
            Q_CHECK_PTR(buffer);
            siz = std::min(siz, size);
        } else {
            QtPrivate::sizedFree(buffer, capacity, sizeof(Type));
            capacity = size;
            buffer = nullptr;
            siz = 0;
        }
    }